

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O3

void __thiscall Fl_Widget::damage(Fl_Widget *this,uchar fl,int X,int Y,int W,int H)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  byte bVar6;
  Fl_Region p_Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  XRectangle R;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  
  while (*(uchar *)((long)&((Fl_Group *)this)->super_Fl_Widget + 0x6c) < 0xf0) {
    puVar1 = (uchar *)((long)&((Fl_Group *)this)->super_Fl_Widget + 0x6d);
    *puVar1 = *puVar1 | fl;
    this = *(Fl_Widget **)((long)&((Fl_Group *)this)->super_Fl_Widget + 8);
    fl = 1;
    if ((Fl_Group *)this == (Fl_Group *)0x0) {
      return;
    }
  }
  pp_Var4 = (((Fl_Group *)((long)this + 0xa0))->super_Fl_Widget)._vptr_Fl_Widget;
  if (pp_Var4 == (_func_int **)0x0) {
    return;
  }
  iVar11 = 0;
  if (0 < X) {
    iVar11 = X;
  }
  if (-1 < X) {
    X = 0;
  }
  iVar12 = 0;
  if (0 < Y) {
    iVar12 = Y;
  }
  iVar8 = 0;
  if (Y < 0) {
    iVar8 = Y;
  }
  iVar2 = (((Fl_Group *)this)->super_Fl_Widget).w_;
  iVar3 = (((Fl_Group *)this)->super_Fl_Widget).h_;
  iVar9 = iVar2 - iVar11;
  if (X + W < iVar9) {
    iVar9 = X + W;
  }
  iVar10 = iVar3 - iVar12;
  if (iVar8 + H < iVar10) {
    iVar10 = iVar8 + H;
  }
  if (iVar9 < 1) {
    return;
  }
  if (iVar10 < 1) {
    return;
  }
  if (((iVar12 == 0 && iVar11 == 0) && (iVar9 == iVar2)) && (iVar10 == iVar3)) {
    damage(this,fl);
    return;
  }
  bVar6 = (((Fl_Group *)this)->super_Fl_Widget).damage_;
  p_Var5 = pp_Var4[3];
  if (bVar6 == 0) {
    if (p_Var5 != (_func_int *)0x0) {
      XDestroyRegion(p_Var5);
    }
    p_Var7 = XRectangleRegion(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0,0x1a47f1);
    pp_Var4[3] = (_func_int *)p_Var7;
  }
  else {
    if (p_Var5 != (_func_int *)0x0) {
      local_38 = (undefined2)iVar11;
      local_36 = (undefined2)iVar12;
      local_34 = (undefined2)iVar9;
      local_32 = (undefined2)iVar10;
      XUnionRectWithRegion(&local_38,p_Var5);
      bVar6 = (((Fl_Group *)this)->super_Fl_Widget).damage_;
    }
    fl = fl | bVar6;
  }
  (((Fl_Group *)this)->super_Fl_Widget).damage_ = fl;
  Fl::damage_ = 1;
  return;
}

Assistant:

void Fl_Widget::damage(uchar fl, int X, int Y, int W, int H) {
  Fl_Widget* wi = this;
  // mark all parent widgets between this and window with FL_DAMAGE_CHILD:
  while (wi->type() < FL_WINDOW) {
    wi->damage_ |= fl;
    wi = wi->parent();
    if (!wi) return;
    fl = FL_DAMAGE_CHILD;
  }
  Fl_X* i = Fl_X::i((Fl_Window*)wi);
  if (!i) return; // window not mapped, so ignore it

  // clip the damage to the window and quit if none:
  if (X < 0) {W += X; X = 0;}
  if (Y < 0) {H += Y; Y = 0;}
  if (W > wi->w()-X) W = wi->w()-X;
  if (H > wi->h()-Y) H = wi->h()-Y;
  if (W <= 0 || H <= 0) return;

  if (!X && !Y && W==wi->w() && H==wi->h()) {
    // if damage covers entire window delete region:
    wi->damage(fl);
    return;
  }

  if (wi->damage()) {
    // if we already have damage we must merge with existing region:
    if (i->region) {
#if defined(USE_X11)
      XRectangle R;
      R.x = X; R.y = Y; R.width = W; R.height = H;
      XUnionRectWithRegion(&R, i->region, i->region);
#elif defined(WIN32)
      Fl_Region R = XRectangleRegion(X, Y, W, H);
      CombineRgn(i->region, i->region, R, RGN_OR);
      XDestroyRegion(R);
#elif defined(__APPLE_QUARTZ__)
      CGRect arg = fl_cgrectmake_cocoa(X, Y, W, H);
      int j; // don't add a rectangle totally inside the Fl_Region
      for(j = 0; j < i->region->count; j++) {
        if(CGRectContainsRect(i->region->rects[j], arg)) break;
      }
      if( j >= i->region->count) {
        i->region->rects = (CGRect*)realloc(i->region->rects, (++(i->region->count)) * sizeof(CGRect));
        i->region->rects[i->region->count - 1] = arg;
      }
#else
# error unsupported platform
#endif
    }
    wi->damage_ |= fl;
  } else {
    // create a new region:
    if (i->region) XDestroyRegion(i->region);
    i->region = XRectangleRegion(X,Y,W,H);
    wi->damage_ = fl;
  }
  Fl::damage(FL_DAMAGE_CHILD);
}